

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int openDirectory(char *zFilename,int *pFd)

{
  int iVar1;
  int errcode;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  char local_238 [528];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_238,0xaa,0x201);
  sqlite3_snprintf(0x200,local_238,"%s",zFilename);
  uVar2 = strlen(local_238);
  do {
    if ((int)uVar2 < 1) {
      if (local_238[0] != '/') {
        local_238[0] = '.';
      }
      pcVar3 = local_238 + 1;
      goto LAB_0012fd27;
    }
    uVar4 = uVar2 & 0xffffffff;
    uVar2 = (ulong)((int)uVar2 - 1);
  } while (local_238[uVar4] != '/');
  pcVar3 = local_238 + uVar4;
LAB_0012fd27:
  *pcVar3 = '\0';
  errcode = 0;
  iVar1 = robust_open(local_238,0,0);
  *pFd = iVar1;
  if (iVar1 < 0) {
    errcode = sqlite3CantopenError(0xa554);
    unixLogErrorAtLine(errcode,"openDirectory",local_238,0xa554);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return errcode;
  }
  __stack_chk_fail();
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  int ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];

  sqlite3_snprintf(MAX_PATHNAME, zDirname, "%s", zFilename);
  for(ii=(int)strlen(zDirname); ii>0 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
  }else{
    if( zDirname[0]!='/' ) zDirname[0] = '.';
    zDirname[1] = 0;
  }
  fd = robust_open(zDirname, O_RDONLY|O_BINARY, 0);
  if( fd>=0 ){
    OSTRACE(("OPENDIR %-3d %s\n", fd, zDirname));
  }
  *pFd = fd;
  if( fd>=0 ) return SQLITE_OK;
  return unixLogError(SQLITE_CANTOPEN_BKPT, "openDirectory", zDirname);
}